

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeIntegerValues
          (SequentialQuantizationAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  PointCloudDecoder *this_00;
  SequentialAttributeDecoder *in_RDI;
  DecoderBuffer *in_stack_00000038;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_stack_00000040;
  SequentialIntegerAttributeDecoder *in_stack_00000048;
  
  this_00 = SequentialAttributeDecoder::decoder(in_RDI);
  uVar2 = PointCloudDecoder::bitstream_version(this_00);
  if ((uVar2 < 0x200) &&
     (uVar3 = (*in_RDI->_vptr_SequentialAttributeDecoder[0xd])(), (uVar3 & 1) == 0)) {
    return false;
  }
  bVar1 = SequentialIntegerAttributeDecoder::DecodeIntegerValues
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::DecodeIntegerValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder()->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0) &&
      !DecodeQuantizedDataInfo()) {
    return false;
  }
#endif
  return SequentialIntegerAttributeDecoder::DecodeIntegerValues(point_ids,
                                                                in_buffer);
}